

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmse.cc
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  char *__s;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  value_type_conflict *__val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_t sVar8;
  long lVar9;
  char *__s_00;
  size_type __n;
  long lVar10;
  int iVar11;
  uint read_size;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  int vector_length;
  vector<double,_std::allocator<double>_> mean_squared_error;
  double magic_number;
  StatisticsAccumulation accumulation;
  vector<double,_std::allocator<double>_> data2;
  vector<double,_std::allocator<double>_> data1;
  ostringstream error_message_6;
  Buffer buffer_for_mean_squared_error;
  ifstream ifs2;
  option long_options [2];
  ifstream ifs1;
  Buffer buffer_for_mean;
  uint local_7c4;
  string local_7c0;
  allocator_type local_799;
  vector<double,_std::allocator<double>_> local_798;
  ulong local_778;
  uint local_76c;
  string *local_768;
  ulong local_760;
  double local_758;
  StatisticsAccumulation local_750;
  long local_738;
  size_type local_730;
  vector<double,_std::allocator<double>_> local_728;
  vector<double,_std::allocator<double>_> local_710;
  string local_6f8 [3];
  ios_base local_688 [264];
  Buffer local_580;
  string local_500;
  byte abStack_4e0 [80];
  ios_base local_490 [408];
  option local_2f8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  string local_2b8;
  byte abStack_298 [80];
  ios_base local_248 [408];
  Buffer local_b0;
  
  local_7c4 = 0xffffffff;
  local_758 = 0.0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2f8.flag = (int *)0x0;
  local_2f8.val = 1000;
  local_2f8._28_4_ = 0;
  local_2f8.name = "magic";
  local_2f8.has_arg = 1;
  local_2f8._12_4_ = 0;
  local_778 = 0;
  local_760 = 0;
  iVar11 = 0;
  do {
    iVar6 = ya_getopt_long_only(argc,argv,"l:m:fh",&local_2f8,(int *)0x0);
    if (7 < iVar6 - 0x66U) {
      if (iVar6 != -1) {
        if (iVar6 != 1000) goto switchD_00103780_caseD_67;
        std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_500);
        bVar2 = sptk::ConvertStringToDouble(&local_2b8,&local_758);
        paVar7 = &local_2b8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != paVar7) {
          operator_delete(local_2b8._M_dataplus._M_p);
          paVar7 = extraout_RAX;
        }
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,"The argument for the -magic option must be numeric",0x32
                    );
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"rmse","");
          sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2b8);
          goto LAB_00103a14;
        }
        local_760 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
        goto LAB_001037f0;
      }
      iVar6 = 2;
      goto LAB_00103a4d;
    }
    switch(iVar6) {
    case 0x66:
      local_778 = CONCAT71((int7)((ulong)((long)&switchD_00103780::switchdataD_0010d028 +
                                         (long)(int)(&switchD_00103780::switchdataD_0010d028)
                                                    [iVar6 - 0x66U]) >> 8),1);
LAB_001037f0:
      iVar6 = 0;
      break;
    default:
switchD_00103780_caseD_67:
      anon_unknown.dwarf_340a::PrintUsage((ostream *)&std::cerr);
      goto LAB_00103a42;
    case 0x68:
      anon_unknown.dwarf_340a::PrintUsage((ostream *)&std::cout);
      iVar11 = 0;
      iVar6 = 1;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_500);
      bVar4 = sptk::ConvertStringToInteger(&local_2b8,(int *)&local_7c4);
      bVar2 = 0 < (int)local_7c4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (bVar4 && bVar2) goto LAB_001038d1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"The argument for the -l option must be a positive integer",
                 0x39);
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"rmse","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2b8);
LAB_00103a14:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
      std::ios_base::~ios_base(local_248);
LAB_00103a42:
      iVar6 = 1;
      iVar11 = 1;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_2b8,ya_optarg,(allocator *)&local_500);
      bVar2 = sptk::ConvertStringToInteger(&local_2b8,(int *)&local_7c4);
      bVar4 = (int)local_7c4 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2b8,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2b8,"non-negative integer",0x14);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"rmse","");
        sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2b8);
        goto LAB_00103a14;
      }
      local_7c4 = local_7c4 + 1;
LAB_001038d1:
      iVar6 = 0;
    }
LAB_00103a4d:
  } while (iVar6 == 0);
  if (iVar6 != 2) {
    return iVar11;
  }
  if (argc - ya_optind == 1) {
    lVar10 = (long)argc + -1;
    __s_00 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b8,"Just two input files, file1, and infile, are required",0x35)
      ;
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"rmse","");
      sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2b8);
      goto LAB_00103bee;
    }
    lVar10 = (long)argc + -2;
    __s_00 = argv[(long)argc + -1];
  }
  __s = argv[lVar10];
  bVar2 = sptk::SetBinaryMode();
  if (bVar2) {
    std::ifstream::ifstream(&local_2b8);
    std::ifstream::open((char *)&local_2b8,(_Ios_Openmode)__s);
    if ((abStack_298[*(long *)(local_2b8._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_768 = &local_500;
      std::ifstream::ifstream(local_768);
      if ((__s_00 == (char *)0x0) ||
         (std::ifstream::open((char *)&local_500,(_Ios_Openmode)__s_00),
         (abStack_4e0[*(long *)(local_500._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          local_768 = (string *)&std::cin;
        }
        sptk::StatisticsAccumulation::StatisticsAccumulation(&local_750,0,1,false,false);
        sptk::StatisticsAccumulation::Buffer::Buffer(&local_580);
        sptk::StatisticsAccumulation::Buffer::Buffer(&local_b0);
        if (local_750.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6f8,"Failed to initialize StatisticsAccumulation",0x2b);
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
          sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
          std::ios_base::~ios_base(local_688);
          iVar11 = 1;
        }
        else {
          read_size = 1;
          if (local_7c4 != 0xffffffff) {
            read_size = local_7c4;
          }
          __n = (size_type)(int)read_size;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_710,__n,(allocator_type *)local_6f8);
          local_730 = __n;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_728,__n,(allocator_type *)local_6f8);
          bVar2 = 0 < (int)read_size;
          local_738 = -(ulong)read_size;
          local_76c = read_size;
          do {
            do {
              bVar4 = sptk::ReadStream<double>
                                (false,0,0,read_size,&local_710,(istream *)&local_2b8,(int *)0x0);
              if ((!bVar4) ||
                 (bVar4 = sptk::ReadStream<double>
                                    (false,0,0,read_size,&local_728,(istream *)local_768,(int *)0x0)
                 , !bVar4)) {
                if (local_7c4 == 0xffffffff) {
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)operator_new(8);
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  *local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start = 0.0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  bVar2 = sptk::StatisticsAccumulation::GetMean(&local_750,&local_580,&local_798);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_6f8,"Failed to get mean squared error",0x20);
                    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
                    sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                    goto LAB_00104565;
                  }
                  dVar1 = *local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if (dVar1 < 0.0) {
                    dVar1 = sqrt(dVar1);
                  }
                  else {
                    dVar1 = SQRT(dVar1);
                  }
                  bVar2 = sptk::WriteStream<double>(dVar1,(ostream *)&std::cout);
                  if (!bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_6f8,"Failed to write root mean squared error",0x27);
                    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
                    sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
                      operator_delete(local_7c0._M_dataplus._M_p);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
                    std::ios_base::~ios_base(local_688);
                    iVar11 = 1;
                  }
LAB_001045a2:
                  if (local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (double *)0x0) {
                    operator_delete(local_798.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar2 == false) goto LAB_001045b8;
                }
                else if ((local_778 & 1) == 0) {
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)operator_new(8);
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  *local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start = 0.0;
                  local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  bVar2 = sptk::StatisticsAccumulation::GetMean(&local_750,&local_b0,&local_798);
                  if (bVar2) {
                    bVar4 = sptk::WriteStream<double>
                                      (*local_798.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start,(ostream *)&std::cout);
                    bVar2 = true;
                    if (bVar4) goto LAB_001045a2;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_6f8,"Failed to write root mean squared error",0x27);
                    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
                    sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_6f8,"Failed to get root mean squared error",0x25);
                    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
                    sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                  }
LAB_00104565:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
                    operator_delete(local_7c0._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
                  std::ios_base::~ios_base(local_688);
                  iVar11 = 1;
                  bVar2 = false;
                  goto LAB_001045a2;
                }
                iVar11 = 0;
                goto LAB_001045b8;
              }
              bVar4 = bVar2;
              if (0 < (int)read_size) {
                lVar10 = 1;
                do {
                  if ((local_760 & 1) == 0) {
LAB_00103f47:
                    local_7c0._M_dataplus._M_p =
                         (pointer)((local_710.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar10 + -1] -
                                   local_728.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar10 + -1]) *
                                  (local_710.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar10 + -1] -
                                  local_728.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar10 + -1]));
                    __l._M_len = 1;
                    __l._M_array = (iterator)&local_7c0;
                    std::vector<double,_std::allocator<double>_>::vector
                              ((vector<double,_std::allocator<double>_> *)local_6f8,__l,
                               (allocator_type *)&local_798);
                    bVar5 = sptk::StatisticsAccumulation::Run
                                      (&local_750,
                                       (vector<double,_std::allocator<double>_> *)local_6f8,
                                       &local_580);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6f8[0]._M_dataplus._M_p !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      operator_delete(local_6f8[0]._M_dataplus._M_p);
                    }
                    if (!bVar5) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_6f8,"Failed to accumulate statistics",0x1f);
                      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_7c0,"rmse","");
                      sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
                        operator_delete(local_7c0._M_dataplus._M_p);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
                      std::ios_base::~ios_base(local_688);
                      iVar11 = 1;
                    }
                    if (!bVar5) break;
                  }
                  else if ((local_758 !=
                            local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10 + -1]) ||
                          (NAN(local_758) ||
                           NAN(local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar10 + -1]))) {
                    if ((local_758 !=
                         local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10 + -1]) ||
                       (NAN(local_758) ||
                        NAN(local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10 + -1]))) goto LAB_00103f47;
                  }
                  bVar4 = lVar10 < (long)local_730;
                  lVar9 = local_738 + lVar10;
                  lVar10 = lVar10 + 1;
                } while (lVar9 != 0);
              }
              read_size = local_76c;
              if (bVar4) goto LAB_001045b8;
            } while (local_7c4 == 0xffffffff);
            local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)operator_new(8);
            local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
            *local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = 0.0;
            local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            bVar4 = sptk::StatisticsAccumulation::GetMean(&local_750,&local_580,&local_798);
            if (bVar4) {
              dVar1 = *local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (dVar1 < 0.0) {
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)sqrt(dVar1);
              }
              else {
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)SQRT(dVar1);
              }
              if ((local_778 & 1) == 0) {
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)&local_7c0;
                local_7c0._M_dataplus._M_p = (pointer)paVar7;
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_6f8,__l_00,&local_799);
                bVar4 = sptk::StatisticsAccumulation::Run
                                  (&local_750,(vector<double,_std::allocator<double>_> *)local_6f8,
                                   &local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6f8[0]._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_6f8[0]._M_dataplus._M_p);
                }
                if (!bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6f8,"Failed to accumulate statistics",0x1f);
                  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
                  sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                  goto LAB_00104146;
                }
              }
              else {
                bVar4 = sptk::WriteStream<double>((double)paVar7,(ostream *)&std::cout);
                if (!bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6f8,"Failed to write root mean squared error",0x27);
                  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
                  sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
                  goto LAB_00104146;
                }
              }
              bVar4 = true;
              sptk::StatisticsAccumulation::Clear(&local_750,&local_580);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6f8,"Failed to get mean squared error",0x20);
              local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"rmse","");
              sptk::PrintErrorMessage(&local_7c0,(ostringstream *)local_6f8);
LAB_00104146:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
                operator_delete(local_7c0._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
              std::ios_base::~ios_base(local_688);
              iVar11 = 1;
              bVar4 = false;
            }
            if (local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_798.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          } while (bVar4);
LAB_001045b8:
          if (local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        sptk::StatisticsAccumulation::Buffer::~Buffer(&local_b0);
        sptk::StatisticsAccumulation::Buffer::~Buffer(&local_580);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6f8,"Cannot open file ",0x11);
        sVar8 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,__s_00,sVar8);
        local_580._vptr_Buffer = (_func_int **)&local_580.first_order_statistics_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"rmse","");
        sptk::PrintErrorMessage((string *)&local_580,(ostringstream *)local_6f8);
        if ((vector<double,_std::allocator<double>_> *)local_580._vptr_Buffer !=
            &local_580.first_order_statistics_) {
          operator_delete(local_580._vptr_Buffer);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
        iVar11 = 1;
      }
      std::ifstream::~ifstream(&local_500);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_500);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_500,"Cannot open file ",0x11);
      if (__s == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffff828 +
                        (int)*(undefined8 *)(local_500._M_dataplus._M_p + -0x18) + 0x2d8);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500,__s,sVar8);
      }
      local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"rmse","");
      sptk::PrintErrorMessage(local_6f8,(ostringstream *)&local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != &local_6f8[0].field_2) {
        operator_delete(local_6f8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_500);
      std::ios_base::~ios_base(local_490);
      iVar11 = 1;
    }
    std::ifstream::~ifstream(&local_2b8);
    return iVar11;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"Cannot set translation mode",0x1b);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"rmse","");
  sptk::PrintErrorMessage(&local_500,(ostringstream *)&local_2b8);
LAB_00103bee:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
  std::ios_base::~ios_base(local_248);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kMagicNumberForEndOfFile);
  double magic_number(0.0);
  bool use_magic_number(kDefaultUseMagicNumber);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:fh", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message << "The argument for the -magic option must be numeric";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        use_magic_number = true;
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file1(NULL);
  const char* input_file2(NULL);
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    input_file1 = argv[argc - 2];
    input_file2 = argv[argc - 1];
  } else if (1 == num_input_files) {
    input_file1 = argv[argc - 1];
    input_file2 = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1, and infile, are required";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(input_file1, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << input_file1;
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }
  std::istream& input_stream1(ifs1);

  std::ifstream ifs2;
  if (NULL != input_file2) {
    ifs2.open(input_file2, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file2;
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }
  std::istream& input_stream2(ifs2.is_open() ? ifs2 : std::cin);

  sptk::StatisticsAccumulation accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer_for_mean_squared_error;
  sptk::StatisticsAccumulation::Buffer buffer_for_mean;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  const int read_size(
      kMagicNumberForEndOfFile == vector_length ? 1 : vector_length);
  std::vector<double> data1(read_size);
  std::vector<double> data2(read_size);
  while (
      sptk::ReadStream(false, 0, 0, read_size, &data1, &input_stream1, NULL) &&
      sptk::ReadStream(false, 0, 0, read_size, &data2, &input_stream2, NULL)) {
    for (int i(0); i < read_size; ++i) {
      if (!use_magic_number ||
          (magic_number != data1[i] && magic_number != data2[i])) {
        const double error(data1[i] - data2[i]);
        if (!accumulation.Run(std::vector<double>{error * error},
                              &buffer_for_mean_squared_error)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
    }

    if (kMagicNumberForEndOfFile != vector_length) {
      std::vector<double> mean_squared_error(1);
      if (!accumulation.GetMean(buffer_for_mean_squared_error,
                                &mean_squared_error)) {
        std::ostringstream error_message;
        error_message << "Failed to get mean squared error";
        sptk::PrintErrorMessage("rmse", error_message);
        return 1;
      }

      const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
      if (output_frame_by_frame) {
        if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write root mean squared error";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      } else {
        if (!accumulation.Run(std::vector<double>{root_mean_squared_error},
                              &buffer_for_mean)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
      accumulation.Clear(&buffer_for_mean_squared_error);
    }
  }

  if (kMagicNumberForEndOfFile == vector_length) {
    std::vector<double> mean_squared_error(1);
    if (!accumulation.GetMean(buffer_for_mean_squared_error,
                              &mean_squared_error)) {
      std::ostringstream error_message;
      error_message << "Failed to get mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
    if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  } else if (!output_frame_by_frame) {
    std::vector<double> mean(1);
    if (!accumulation.GetMean(buffer_for_mean, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to get root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    if (!sptk::WriteStream(mean[0], &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }

  return 0;
}